

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericFacetValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractNumericFacetValidator::inspectFacet
          (AbstractNumericFacetValidator *this,MemoryManager *manager)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  XMLNumber *pXVar4;
  XMLNumber *pXVar5;
  XMLNumber *pXVar6;
  XMLNumber *pXVar7;
  InvalidDatatypeFacetException *pIVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLNumber *pXVar9;
  XMLNumber *pXVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  int result_3;
  int result_2;
  int result_1;
  int result;
  XMLNumber *thisMinExclusive;
  XMLNumber *thisMinInclusive;
  XMLNumber *thisMaxExclusive;
  XMLNumber *thisMaxInclusive;
  int thisFacetsDefined;
  MemoryManager *manager_local;
  AbstractNumericFacetValidator *this_local;
  
  uVar1 = DatatypeValidator::getFacetsDefined(&this->super_DatatypeValidator);
  pXVar4 = getMaxInclusive(this);
  pXVar5 = getMaxExclusive(this);
  pXVar6 = getMinInclusive(this);
  pXVar7 = getMinExclusive(this);
  if (uVar1 != 0) {
    if (((uVar1 & 0x40) != 0) && ((uVar1 & 0x20) != 0)) {
      pIVar8 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar8,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                 ,0x108,FACET_max_Incl_Excl,manager);
      __cxa_throw(pIVar8,&InvalidDatatypeFacetException::typeinfo,
                  InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
    }
    if (((uVar1 & 0x100) != 0) && ((uVar1 & 0x80) != 0)) {
      pIVar8 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar8,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                 ,0x10e,FACET_min_Incl_Excl,manager);
      __cxa_throw(pIVar8,&InvalidDatatypeFacetException::typeinfo,
                  InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
    }
    if ((((uVar1 & 0x20) != 0) && ((uVar1 & 0x80) != 0)) &&
       ((iVar2 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                           (this,pXVar6,pXVar4), iVar2 == 1 || (iVar2 == 2)))) {
      pIVar8 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      iVar2 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[6])();
      iVar3 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[6])();
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar8,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                 ,0x11d,FACET_maxIncl_minIncl,(XMLCh *)CONCAT44(extraout_var,iVar2),
                 (XMLCh *)CONCAT44(extraout_var_00,iVar3),(XMLCh *)0x0,(XMLCh *)0x0,manager);
      __cxa_throw(pIVar8,&InvalidDatatypeFacetException::typeinfo,
                  InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
    }
    if (((uVar1 & 0x40) != 0) && ((uVar1 & 0x100) != 0)) {
      pXVar9 = getMinExclusive(this);
      pXVar10 = getMaxExclusive(this);
      iVar2 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                        (this,pXVar9,pXVar10);
      if ((iVar2 == 1) || (iVar2 == 2)) {
        pIVar8 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar2 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[6])();
        iVar3 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar8,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,299,FACET_maxExcl_minExcl,(XMLCh *)CONCAT44(extraout_var_01,iVar2),
                   (XMLCh *)CONCAT44(extraout_var_02,iVar3),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar8,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
    }
    if (((uVar1 & 0x20) != 0) && ((uVar1 & 0x100) != 0)) {
      pXVar9 = getMinExclusive(this);
      pXVar10 = getMaxInclusive(this);
      iVar2 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                        (this,pXVar9,pXVar10);
      if (iVar2 != -1) {
        pIVar8 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar2 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[6])();
        iVar3 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar8,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x139,FACET_maxIncl_minExcl,(XMLCh *)CONCAT44(extraout_var_03,iVar2),
                   (XMLCh *)CONCAT44(extraout_var_04,iVar3),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar8,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
    }
    if (((uVar1 & 0x40) != 0) && ((uVar1 & 0x80) != 0)) {
      pXVar4 = getMinInclusive(this);
      pXVar7 = getMaxExclusive(this);
      iVar2 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                        (this,pXVar4,pXVar7);
      if (iVar2 != -1) {
        pIVar8 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar2 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[6])();
        iVar3 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar8,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x147,FACET_maxExcl_minIncl,(XMLCh *)CONCAT44(extraout_var_05,iVar2),
                   (XMLCh *)CONCAT44(extraout_var_06,iVar3),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar8,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
    }
    (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0xe])(this,manager);
  }
  return;
}

Assistant:

void AbstractNumericFacetValidator::inspectFacet(MemoryManager* const manager)
{

    int thisFacetsDefined = getFacetsDefined();
    XMLNumber *thisMaxInclusive = getMaxInclusive();
    XMLNumber *thisMaxExclusive = getMaxExclusive();
    XMLNumber *thisMinInclusive = getMinInclusive();
    XMLNumber *thisMinExclusive = getMinExclusive();

    if (!thisFacetsDefined)
        return;

    // non co-existence checking
    // check 4.3.8.c1 error: maxInclusive + maxExclusive
    if (((thisFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0) &&
        ((thisFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0) )
        ThrowXMLwithMemMgr(InvalidDatatypeFacetException, XMLExcepts::FACET_max_Incl_Excl, manager);

    // non co-existence checking
    // check 4.3.9.c1 error: minInclusive + minExclusive
    if (((thisFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0) &&
        ((thisFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0) )
        ThrowXMLwithMemMgr(InvalidDatatypeFacetException, XMLExcepts::FACET_min_Incl_Excl, manager);

    //
    // minExclusive < minInclusive <= maxInclusive < maxExclusive
    //
    // check 4.3.7.c1 must: minInclusive <= maxInclusive
    if (((thisFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0) &&
        ((thisFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0) )
    {
        int result = compareValues(thisMinInclusive, thisMaxInclusive);
        if ( result == 1 || result == INDETERMINATE )
        {
            REPORT_FACET_ERROR(thisMinInclusive
                             , thisMaxInclusive
                             , XMLExcepts::FACET_maxIncl_minIncl
                             , manager)
        }
    }

    // check 4.3.8.c2 must: minExclusive <= maxExclusive
    if ( ((thisFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0) &&
        ((thisFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0) )
    {
        int result = compareValues(getMinExclusive(), getMaxExclusive());
        if ( result == 1 || result == INDETERMINATE )
        {
            REPORT_FACET_ERROR(thisMinExclusive
                             , thisMaxExclusive
                             , XMLExcepts::FACET_maxExcl_minExcl
                             , manager)
        }
    }

    // check 4.3.9.c2 must: minExclusive < maxInclusive
    if ( ((thisFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0) &&
        ((thisFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0) )
    {
        int result = compareValues(getMinExclusive(), getMaxInclusive());
        if ( result != -1 )
        {
            REPORT_FACET_ERROR(thisMinExclusive
                             , thisMaxInclusive
                             , XMLExcepts::FACET_maxIncl_minExcl
                             , manager)
        }
    }

    // check 4.3.10.c1 must: minInclusive < maxExclusive
    if ( ((thisFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0) &&
        ((thisFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0) )
    {
        int result = compareValues(getMinInclusive(), getMaxExclusive());
        if ( result != -1)
        {
            REPORT_FACET_ERROR(thisMinInclusive
                             , thisMaxExclusive
                             , XMLExcepts::FACET_maxExcl_minIncl
                             , manager)
        }
    }

    checkAdditionalFacetConstraints(manager);

}